

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatterTest_FormatUCharString_Test::~FormatterTest_FormatUCharString_Test
          (FormatterTest_FormatUCharString_Test *this)

{
  void *in_RDI;
  
  ~FormatterTest_FormatUCharString_Test((FormatterTest_FormatUCharString_Test *)0x19fed8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(FormatterTest, FormatUCharString) {
  unsigned char str[] = "test";
  EXPECT_EQ("test", format("{0:s}", str));
  const unsigned char *const_str = str;
  EXPECT_EQ("test", format("{0:s}", const_str));
  unsigned char *ptr = str;
  EXPECT_EQ("test", format("{0:s}", ptr));
}